

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_libapi.cpp
# Opt level: O0

ze_result_t
zeFabricVertexGetDeviceExp(ze_fabric_vertex_handle_t hVertex,ze_device_handle_t *phDevice)

{
  ze_pfnFabricVertexGetDeviceExp_t p_Var1;
  __pointer_type p_Var2;
  ze_pfnFabricVertexGetDeviceExp_t pfnGetDeviceExp;
  ze_device_handle_t *phDevice_local;
  ze_fabric_vertex_handle_t hVertex_local;
  
  if ((ze_lib::destruction & 1) == 0) {
    p_Var2 = std::atomic<_ze_dditable_t_*>::load
                       ((atomic<_ze_dditable_t_*> *)(ze_lib::context + 0x10),memory_order_seq_cst);
    p_Var1 = (p_Var2->FabricVertexExp).pfnGetDeviceExp;
    if (p_Var1 == (ze_pfnFabricVertexGetDeviceExp_t)0x0) {
      if ((*(byte *)(ze_lib::context + 0xd90) & 1) == 0) {
        hVertex_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
      }
      else {
        hVertex_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
      }
    }
    else {
      hVertex_local._4_4_ = (*p_Var1)(hVertex,phDevice);
    }
  }
  else {
    hVertex_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return hVertex_local._4_4_;
}

Assistant:

ze_result_t ZE_APICALL
zeFabricVertexGetDeviceExp(
    ze_fabric_vertex_handle_t hVertex,              ///< [in] handle of the fabric vertex
    ze_device_handle_t* phDevice                    ///< [out] device handle corresponding to fabric vertex
    )
{
    #ifdef DYNAMIC_LOAD_LOADER
    ze_result_t result = ZE_RESULT_SUCCESS;
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    static const ze_pfnFabricVertexGetDeviceExp_t pfnGetDeviceExp = [&result] {
        auto pfnGetDeviceExp = ze_lib::context->zeDdiTable.load()->FabricVertexExp.pfnGetDeviceExp;
        if( nullptr == pfnGetDeviceExp ) {
            result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }
        return pfnGetDeviceExp;
    }();
    if (result != ZE_RESULT_SUCCESS) {
        return result;
    }
    return pfnGetDeviceExp( hVertex, phDevice );
    #else
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    auto pfnGetDeviceExp = ze_lib::context->zeDdiTable.load()->FabricVertexExp.pfnGetDeviceExp;
    if( nullptr == pfnGetDeviceExp ) {
        if(!ze_lib::context->isInitialized)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        else
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
    }

    return pfnGetDeviceExp( hVertex, phDevice );
    #endif
}